

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.h
# Opt level: O0

void __thiscall cfd::UtxoData::~UtxoData(UtxoData *this)

{
  Script *in_RDI;
  
  core::Script::~Script(in_RDI);
  core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x1eb540);
  core::BlindFactor::~BlindFactor((BlindFactor *)0x1eb551);
  core::BlindFactor::~BlindFactor((BlindFactor *)0x1eb562);
  core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)in_RDI);
  core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1eb584);
  std::__cxx11::string::~string((string *)&in_RDI[10].script_data_);
  core::Address::~Address((Address *)in_RDI);
  core::Script::~Script(in_RDI);
  core::Script::~Script(in_RDI);
  core::Txid::~Txid((Txid *)0x1eb5d3);
  core::BlockHash::~BlockHash((BlockHash *)0x1eb5e1);
  return;
}

Assistant:

struct CFD_EXPORT UtxoData {
 public:
  uint64_t block_height = 0;  //!< blick height
  BlockHash block_hash;       //!< block hash
  Txid txid;                  //!< txid
  uint32_t vout = 0;          //!< vout
  Script locking_script;      //!< locking script
  Script redeem_script;       //!< script
  Address address;            //!< address
  std::string descriptor;     //!< output descriptor
  Amount amount;              //!< amount
  //! address type
  AddressType address_type = AddressType::kP2shAddress;
  //! binary data option
  void* binary_data = nullptr;
#ifndef CFD_DISABLE_ELEMENTS
  ConfidentialAssetId asset;  //!< asset
  // elements
  ElementsConfidentialAddress confidential_address;  //!< Confidential address
  BlindFactor asset_blind_factor;                    //!< asset blind factor
  BlindFactor amount_blind_factor;                   //!< blind vactor
  ConfidentialValue value_commitment;                //!< value commitment
#endif                                               // CFD_DISABLE_ELEMENTS
  Script scriptsig_template;                         //!< scriptsig template

 public:
  /**
   * @brief constructor.
   */
  UtxoData();
#ifndef CFD_DISABLE_ELEMENTS
  /**
   * @brief constructor.
   * @param[in] block_height    block_height
   * @param[in] block_hash    block_hash
   * @param[in] txid    txid
   * @param[in] vout    vout
   * @param[in] locking_script    locking_script
   * @param[in] redeem_script    redeem_script
   * @param[in] address    address
   * @param[in] descriptor    descriptor
   * @param[in] amount    amount
   * @param[in] address_type    address_type
   * @param[in] binary_data    binary_data
   * @param[in] asset    asset
   * @param[in] confidential_address    confidential_address
   * @param[in] asset_blind_factor    asset_blind_factor
   * @param[in] amount_blind_factor    amount_blind_factor
   * @param[in] value_commitment    value_commitment
   * @param[in] scriptsig_template    scriptsig_template
   */
  explicit UtxoData(
      uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
      uint32_t vout, const Script& locking_script, const Script& redeem_script,
      const Address& address, const std::string& descriptor,
      const Amount& amount, AddressType address_type, void* binary_data,
      const ConfidentialAssetId& asset,
      const ElementsConfidentialAddress& confidential_address,
      const BlindFactor& asset_blind_factor,
      const BlindFactor& amount_blind_factor,
      const ConfidentialValue& value_commitment,
      const Script& scriptsig_template);
#else
  /**
   * @brief constructor.
   * @param[in] block_height    block_height
   * @param[in] block_hash    block_hash
   * @param[in] txid    txid
   * @param[in] vout    vout
   * @param[in] locking_script    locking_script
   * @param[in] redeem_script    redeem_script
   * @param[in] address    address
   * @param[in] descriptor    descriptor
   * @param[in] amount    amount
   * @param[in] address_type    address_type
   * @param[in] binary_data    binary_data
   * @param[in] scriptsig_template    scriptsig_template
   */
  explicit UtxoData(
      uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
      uint32_t vout, const Script& locking_script, const Script& redeem_script,
      const Address& address, const std::string& descriptor,
      const Amount& amount, AddressType address_type, void* binary_data,
      const Script& scriptsig_template);
#endif  // CFD_DISABLE_ELEMENTS
  /**
   * @brief copy constructor.
   * @param[in] object    object
   */
  UtxoData(const UtxoData& object);
  /**
   * @brief copy constructor.
   * @param[in] object    object
   * @return object
   */
  UtxoData& operator=(const UtxoData& object) &;
}